

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

ParseLocation __thiscall
google::protobuf::TextFormat::ParseInfoTree::GetLocation
          (ParseInfoTree *this,FieldDescriptor *field,int index)

{
  second_type *this_00;
  size_type sVar1;
  const_reference pvVar2;
  ParseLocation PVar3;
  int in_EDX;
  first_type *in_RDI;
  vector<google::protobuf::TextFormat::ParseLocation,_std::allocator<google::protobuf::TextFormat::ParseLocation>_>
  *locations;
  int in_stack_0000009c;
  FieldDescriptor *in_stack_000000a0;
  map<const_google::protobuf::FieldDescriptor_*,_std::vector<google::protobuf::TextFormat::ParseLocation,_std::allocator<google::protobuf::TextFormat::ParseLocation>_>,_std::less<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::vector<google::protobuf::TextFormat::ParseLocation,_std::allocator<google::protobuf::TextFormat::ParseLocation>_>_>_>_>
  *in_stack_ffffffffffffffd8;
  int local_1c;
  ParseLocation local_8;
  
  CheckFieldIndex(in_stack_000000a0,in_stack_0000009c);
  local_1c = in_EDX;
  if (in_EDX == -1) {
    local_1c = 0;
  }
  this_00 = FindOrNull<std::map<google::protobuf::FieldDescriptor_const*,std::vector<google::protobuf::TextFormat::ParseLocation,std::allocator<google::protobuf::TextFormat::ParseLocation>>,std::less<google::protobuf::FieldDescriptor_const*>,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,std::vector<google::protobuf::TextFormat::ParseLocation,std::allocator<google::protobuf::TextFormat::ParseLocation>>>>>>
                      (in_stack_ffffffffffffffd8,in_RDI);
  if ((this_00 != (second_type *)0x0) &&
     (sVar1 = std::
              vector<google::protobuf::TextFormat::ParseLocation,_std::allocator<google::protobuf::TextFormat::ParseLocation>_>
              ::size(this_00), (ulong)(long)local_1c < sVar1)) {
    pvVar2 = std::
             vector<google::protobuf::TextFormat::ParseLocation,_std::allocator<google::protobuf::TextFormat::ParseLocation>_>
             ::operator[](this_00,(long)local_1c);
    PVar3.line = pvVar2->line;
    PVar3.column = pvVar2->column;
    return PVar3;
  }
  ParseLocation::ParseLocation(&local_8);
  return local_8;
}

Assistant:

TextFormat::ParseLocation TextFormat::ParseInfoTree::GetLocation(
    const FieldDescriptor* field, int index) const {
  CheckFieldIndex(field, index);
  if (index == -1) {
    index = 0;
  }

  const std::vector<TextFormat::ParseLocation>* locations =
      FindOrNull(locations_, field);
  if (locations == nullptr || index >= locations->size()) {
    return TextFormat::ParseLocation();
  }

  return (*locations)[index];
}